

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O3

void __thiscall duckdb::HyperLogLog::Serialize(HyperLogLog *this,Serializer *serializer)

{
  void *pvVar1;
  bool bVar2;
  tuple<duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_> tVar3;
  HLLV1 o;
  pointer pHVar4;
  uint64_t uVar5;
  __uniq_ptr_impl<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>_> local_20;
  
  bVar2 = SerializationCompatibility::Compare(&(serializer->options).serialization_compatibility,3);
  if (bVar2) {
    (*serializer->_vptr_Serializer[2])(serializer,100,"type");
    Serializer::WriteValue<duckdb::HLLStorageType>(serializer,HLL_V2);
    (*serializer->_vptr_Serializer[3])(serializer);
    (*serializer->_vptr_Serializer[2])(serializer,0x65,"data");
    (*serializer->_vptr_Serializer[0x1e])(serializer,this,0x40);
    (*serializer->_vptr_Serializer[3])(serializer);
    return;
  }
  tVar3.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
  super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)operator_new(8);
  o.hll = duckdb_hll::hll_create();
  *(robj **)tVar3.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
            super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl = o.hll;
  duckdb_hll::hllSparseToDense(o.hll);
  local_20._M_t.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
  super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl =
       (tuple<duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)
       (tuple<duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)
       tVar3.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
       super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl;
  pHVar4 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
                     ((unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *)
                      &local_20);
  HLLV1::FromNew(pHVar4,this);
  (*serializer->_vptr_Serializer[2])(serializer,100,"type");
  Serializer::WriteValue<duckdb::HLLStorageType>(serializer,HLL_V1);
  (*serializer->_vptr_Serializer[3])(serializer);
  pHVar4 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
                     ((unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *)
                      &local_20);
  pvVar1 = pHVar4->hll->ptr;
  unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
            ((unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *)&local_20);
  uVar5 = duckdb_hll::get_size();
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"data");
  (*serializer->_vptr_Serializer[0x1e])(serializer,pvVar1,uVar5);
  (*serializer->_vptr_Serializer[3])(serializer);
  if (local_20._M_t.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
      super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)0x0) {
    ::std::default_delete<duckdb::HLLV1>::operator()
              ((default_delete<duckdb::HLLV1> *)&local_20,
               (HLLV1 *)local_20._M_t.
                        super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>
                        .super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void HyperLogLog::Serialize(Serializer &serializer) const {
	if (serializer.ShouldSerialize(3)) {
		serializer.WriteProperty(100, "type", HLLStorageType::HLL_V2);
		serializer.WriteProperty(101, "data", k, sizeof(k));
	} else {
		auto old = make_uniq<HLLV1>();
		old->FromNew(*this);

		serializer.WriteProperty(100, "type", HLLStorageType::HLL_V1);
		serializer.WriteProperty(101, "data", old->GetPtr(), old->GetSize());
	}
}